

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

void __thiscall ASDCP::MXF::Primer::Dump(Primer *this,FILE *stream)

{
  _Base_ptr p_Var1;
  size_t sVar2;
  MDDEntry *pMVar3;
  size_t sVar4;
  _Base_ptr p_Var5;
  char *pcVar6;
  _Self __tmp;
  char identbuf [128];
  char local_b8 [136];
  
  if (this->m_Dict != (Dictionary *)0x0) {
    if (stream == (FILE *)0x0) {
      stream = (FILE *)_stderr;
    }
    KLVPacket::Dump((KLVPacket *)this,stream,this->m_Dict,false);
    sVar2 = *(size_t *)
             ((long)&(this->LocalTagEntryBatch).
                     super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>_>
                     .super_PushSet<ASDCP::MXF::Primer::LocalTagEntry>.
                     super_set<ASDCP::MXF::Primer::LocalTagEntry,_std::less<ASDCP::MXF::Primer::LocalTagEntry>,_std::allocator<ASDCP::MXF::Primer::LocalTagEntry>_>
                     ._M_t._M_impl.super__Rb_tree_header + 0x20);
    pcVar6 = "entries";
    if (sVar2 == 1) {
      pcVar6 = "entry";
    }
    fprintf((FILE *)stream,"Primer: %u %s\n",sVar2,pcVar6);
    p_Var5 = *(_Base_ptr *)
              ((long)&(this->LocalTagEntryBatch).
                      super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>_>
                      .super_PushSet<ASDCP::MXF::Primer::LocalTagEntry>.
                      super_set<ASDCP::MXF::Primer::LocalTagEntry,_std::less<ASDCP::MXF::Primer::LocalTagEntry>,_std::allocator<ASDCP::MXF::Primer::LocalTagEntry>_>
                      ._M_t._M_impl.super__Rb_tree_header + 0x10);
    p_Var1 = &(this->LocalTagEntryBatch).
              super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>_>
              .super_PushSet<ASDCP::MXF::Primer::LocalTagEntry>.
              super_set<ASDCP::MXF::Primer::LocalTagEntry,_std::less<ASDCP::MXF::Primer::LocalTagEntry>,_std::allocator<ASDCP::MXF::Primer::LocalTagEntry>_>
              ._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var5 != p_Var1) {
      do {
        pMVar3 = Dictionary::FindULAnyVersion
                           (this->m_Dict,(byte_t *)((long)&p_Var5[1]._M_right + 1));
        snprintf(local_b8,0x80,"%02x %02x: ",(ulong)*(byte *)&p_Var5[1]._M_parent,
                 (ulong)*(byte *)((long)&p_Var5[1]._M_parent + 1));
        sVar4 = strlen(local_b8);
        UL::EncodeString((UL *)&p_Var5[1]._M_left,local_b8 + sVar4,0x80 - (int)sVar4);
        pcVar6 = "Unknown";
        if (pMVar3 != (MDDEntry *)0x0) {
          pcVar6 = pMVar3->name;
        }
        fprintf((FILE *)stream,"  %s %s\n",local_b8,pcVar6);
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while (p_Var5 != p_Var1);
    }
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp",
                0x24f,"virtual void ASDCP::MXF::Primer::Dump(FILE *)");
}

Assistant:

void
ASDCP::MXF::Primer::Dump(FILE* stream)
{
  assert(m_Dict);
  char identbuf[IdentBufferLen];

  if ( stream == 0 )
    stream = stderr;

  KLVPacket::Dump(stream, *m_Dict, false);
  fprintf(stream, "Primer: %u %s\n",
	  (ui32_t)LocalTagEntryBatch.size(),
	  ( LocalTagEntryBatch.size() == 1 ? "entry" : "entries" ));
  
  Batch<LocalTagEntry>::iterator i = LocalTagEntryBatch.begin();
  for ( ; i != LocalTagEntryBatch.end(); i++ )
    {
      const MDDEntry* Entry = m_Dict->FindULAnyVersion((*i).UL.Value());
      fprintf(stream, "  %s %s\n", (*i).EncodeString(identbuf, IdentBufferLen), (Entry ? Entry->name : "Unknown"));
    }
}